

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::unpack_group
               (CVmPackPos *p,CVmObjList *retlst_par,int *retcnt_par,CVmPackGroup *group,
               int list_per_iter)

{
  int iVar1;
  wchar_t wVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  long in_RCX;
  int __c;
  CVmObjList *in_RDX;
  CVmObjList *in_RSI;
  CVmPackPos *in_RDI;
  int in_R8D;
  int cnt;
  vm_val_t cntval;
  wchar_t c;
  int grpcnt;
  int *retcnt;
  CVmObjList *retlst;
  CVmDataSource *src;
  undefined4 in_stack_00000050;
  int *in_stack_000000b0;
  CVmPackGroup *in_stack_000000b8;
  int *in_stack_000000c0;
  CVmObjList *in_stack_000000c8;
  CVmPackPos *in_stack_000000d0;
  CVmPackPos *in_stack_ffffffffffffff88;
  CVmPackPos *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  undefined1 local_44 [20];
  long *local_30;
  int local_24;
  long local_20;
  CVmObjList *local_18;
  CVmObjList *local_10;
  CVmPackPos *local_8;
  
  local_30 = *(long **)(in_RCX + 0x30);
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((*(int *)(in_RCX + 0x44) == -2) || (*(int *)(in_RCX + 0x48) != 0)) {
    in_stack_ffffffffffffff98 = (int *)(**(code **)(*local_30 + 0x38))();
    lVar3 = (**(code **)(*local_30 + 0x30))();
    if (lVar3 <= (long)in_stack_ffffffffffffff98) {
      CVmPackPos::set(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      skip_group(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      return;
    }
  }
  local_44._12_8_ = local_10;
  local_44._4_8_ = local_18;
  local_44._0_4_ = 0;
  if (local_24 != 0) {
    in_RSI = local_18;
    local_44._12_8_ =
         create_group_sublist
                   ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
    local_44._4_8_ = local_44;
  }
  do {
    while( true ) {
      while( true ) {
        iVar1 = CVmPackPos::more(in_stack_ffffffffffffff90);
        if (iVar1 == 0) {
          return;
        }
        wVar2 = CVmPackPos::getch(in_stack_ffffffffffffff90);
        if ((wVar2 != L'(') && (wVar2 != L'[')) break;
        in_RSI = (CVmObjList *)local_44._12_8_;
        unpack_subgroup((CVmPackPos *)retcnt_par,(CVmObjList *)group,
                        (int *)CONCAT44(list_per_iter,in_stack_00000050),(CVmPackGroup *)src,
                        (int *)retlst);
      }
      if (wVar2 == *(wchar_t *)(local_20 + 8)) break;
      if (wVar2 == L'/') {
        if ((CVmObjList *)local_44._4_8_ == (CVmObjList *)0x0) {
          pcVar5 = CVmPackPos::index(local_8,(char *)in_RSI,__c);
          err_throw_a(0x6b,1,0,(ulong)pcVar5 & 0xffffffff);
        }
        *(int *)&(((CVmObjCollection *)local_44._4_8_)->super_CVmObject)._vptr_CVmObject =
             *(int *)&(((CVmObjCollection *)local_44._4_8_)->super_CVmObject)._vptr_CVmObject + -1;
        CVmObjList::get_element
                  ((CVmObjList *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                   (vm_val_t *)0x37c9e9);
        in_stack_ffffffffffffffa4 = vm_val_t::cast_to_int((vm_val_t *)in_stack_ffffffffffffff90);
        CVmPackPos::inc(in_stack_ffffffffffffff90);
        wVar2 = CVmPackPos::getch(in_stack_ffffffffffffff90);
        in_RSI = (CVmObjList *)local_44._12_8_;
        if ((wVar2 == L'(') || (wVar2 == L'[')) {
          unpack_subgroup((CVmPackPos *)retcnt_par,(CVmObjList *)group,
                          (int *)CONCAT44(list_per_iter,in_stack_00000050),(CVmPackGroup *)src,
                          (int *)retlst);
        }
        else {
          unpack_iter_item(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                           in_stack_000000b0);
        }
      }
      else {
        in_RSI = (CVmObjList *)local_44._12_8_;
        unpack_iter_item(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                         in_stack_000000b0);
      }
    }
    *(int *)(local_20 + 0x40) = *(int *)(local_20 + 0x40) + 1;
    if (local_24 != 0) {
      CVmObjList::cons_set_len
                ((CVmObjList *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    }
    if (*(int *)(local_20 + 0x44) == -2) {
      in_stack_ffffffffffffff90 = (CVmPackPos *)(**(code **)(*local_30 + 0x38))();
      lVar3 = (**(code **)(*local_30 + 0x30))();
      if (lVar3 <= (long)in_stack_ffffffffffffff90) {
        return;
      }
    }
    else if (*(int *)(local_20 + 0x44) < *(int *)(local_20 + 0x40)) {
      return;
    }
    if (*(int *)(local_20 + 0x48) != 0) {
      in_stack_ffffffffffffff88 = (CVmPackPos *)(**(code **)(*local_30 + 0x38))();
      lVar3 = (**(code **)(*local_30 + 0x30))();
      if (lVar3 <= (long)in_stack_ffffffffffffff88) {
        return;
      }
    }
    in_RSI = (CVmObjList *)(local_20 + 0x18);
    CVmPackPos::set(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    uVar4 = (**(code **)(**(long **)(local_20 + 0x30) + 0x38))();
    *(undefined8 *)(local_20 + 0x38) = uVar4;
    if (local_24 != 0) {
      in_RSI = local_18;
      local_44._12_8_ =
           create_group_sublist
                     ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
      local_44._0_4_ = 0;
    }
  } while( true );
}

Assistant:

void CVmPack::unpack_group(VMG_ CVmPackPos *p,
                           CVmObjList *retlst_par, int *retcnt_par,
                           CVmPackGroup *group, int list_per_iter)
{
    /* get the data source */
    CVmDataSource *src = group->ds;

    /* 
     *   If the group has an "up to" count (e.g., "30*"), check to see if
     *   we're already at EOF, and if so don't unpack anything - an iteration
     *   count of zero is valid for an up-to count. 
     */
    if ((group->num_iters == ITER_STAR || group->up_to_iters)
        && src->get_pos() >= src->get_size())
    {
        /* skip the group in the source */
        p->set(&group->start);
        skip_group(p, group->close_paren);

        /* we're done */
        return;
    }

    /* assume we'll unpack directly into the parent list */
    CVmObjList *retlst = retlst_par;
    int *retcnt = retcnt_par;

    /* 
     *   if we're unpacking into a per-instance sublist, create the sublist
     *   for the first iteration, and set this as the output list instead of
     *   unpacking directly into the parent list
     */
    int grpcnt = 0;
    if (list_per_iter)
    {
        retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
        retcnt = &grpcnt;
    }

    /* run through the format list */
    while (p->more())
    {
        /* check for group entry/exit and repeat counts */
        wchar_t c = p->getch();
        if (c == '(' || c == '[')
        {
            /* start of a group - unpack the sub-group */
            unpack_subgroup(vmg_ p, retlst, *retcnt, group, 0);
        }
        else if (c == group->close_paren)
        {
            /* end of group - count the completed iteration */
            group->cur_iter++;

            /* 
             *   if we're unpacking into a per-iteration sublist, note the
             *   final group count in the sublist 
             */
            if (list_per_iter)
                retlst->cons_set_len(*retcnt);

            /* 
             *   We're done with the group if (a) we have a '*' iteration
             *   count, and we're at end of file, or (b) we've reached the
             *   desired iteration count.  If done, simply return to the
             *   enclosing group. 
             */
            if (group->num_iters == ITER_STAR
                ? src->get_pos() >= src->get_size()
                : group->cur_iter > group->num_iters)
                return;

            /* 
             *   if we have an 'up to' iteration count, stop if we're at EOF
             *   even if we haven't exhausted the numeric iteration count 
             */
            if (group->up_to_iters && src->get_pos() >= src->get_size())
                return;

            /* return to the start of the group template for the next round */
            p->set(&group->start);
            group->stream_ofs = group->ds->get_pos();

            /* 
             *   If we're unpacking into a sublist per iteration, create the
             *   new sublist for the new iteration. 
             */
            if (list_per_iter)
            {
                retlst = create_group_sublist(vmg_ retlst_par, retcnt_par);
                grpcnt = 0;
            }
        }
        else if (c == '/')
        {
            /*
             *   Repeat count prefix.  Remove the preceding return list
             *   element and interpret it as an integer.  Make sure there
             *   actually is an item in the list - it's an error if not.  
             */
            if (retcnt == 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
            
            /* remove the item and cast it to integer */
            vm_val_t cntval;
            retlst->get_element(--(*retcnt), &cntval);
            int cnt = (int)cntval.cast_to_int(vmg0_);

            /* skip the '/' and check what follows */
            p->inc();
            if ((c = p->getch()) == '(' || c == '[')
            {
                /* it's a group - unpack the group with the count */
                unpack_subgroup(vmg_ p, retlst, *retcnt, group, &cnt);
            }
            else
            {
                /* it's a single item - unpack the repeated items */
                unpack_iter_item(vmg_ p, retlst, *retcnt, group, &cnt);
            }
        }
        else
        {
            /* it's a regular item, possibly iterated - unpack it */
            unpack_iter_item(vmg_ p, retlst, *retcnt, group, 0);
        }
    }
}